

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mouseif.c
# Opt level: O2

void make_mouse_instance(MouseInterface mouse)

{
  return;
}

Assistant:

void make_mouse_instance(MouseInterface mouse)
{
#ifdef DOS

  int NumberOfButtons;
  if (nomouseflag) {
    mouse->device.enter = GenericReturnVoid;
    mouse->device.exit = GenericReturnVoid;
    mouse->device.before_raid = GenericReturnVoid;
    mouse->device.after_raid = GenericReturnVoid;
    mouse->device.active = FALSE;
    NumberOfButtons = 3;
  } else {
    mouse->device.enter = &EnterDosMouse;
    mouse->device.exit = &ExitDosMouse;
    mouse->device.before_raid = &DosMouseBeforeRaid;
    mouse->device.after_raid = &DosMouseAfterRaid;
    mouse->device.active = FALSE;
    NumberOfButtons = probemouse();
  }
  mouse->Button.StartTime = 2;

  mouse->Cursor.Last.width = 16;
  mouse->Cursor.Last.height = 16;

  if (nomouseflag == FALSE) {
    if (twobuttonflag) { /* We force two button handling. */
      mouse->Handler = &TwoButtonHandler;
      mouse->Button.TwoButtonP = TRUE;
    } else /* Determine how many buttons we have. */
      switch (NumberOfButtons) {
        case 0x0000: /* Other than 2 buttons, assume three */
          mouse->Button.TwoButtonP = FALSE;
          mouse->Handler = &ThreeButtonHandler;
          break;
        case 0x0002: /* Two buttons. */
          mouse->Button.TwoButtonP = TRUE;
          mouse->Handler = &TwoButtonHandler;
          break;
        case 0x0003: /* Three buttons. */
          mouse->Button.TwoButtonP = FALSE;
          mouse->Handler = &ThreeButtonHandler;
          break;
        case 0xffff: /* Two buttons. */
          mouse->Button.TwoButtonP = TRUE;
          mouse->Handler = &TwoButtonHandler;
          break;
        default: /* Strange case, assume three. */
          mouse->Button.TwoButtonP = FALSE;
          mouse->Handler = &ThreeButtonHandler;
          break;
      }
  }
/* mouse->timestamp = ((*LASTUSERACTION68k& 0xffffff) + Lisp_world); */
#elif XWINDOW
#endif /* DOS or XWINDOW */
}